

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Object.cc
# Opt level: O1

Vector3d *
Object::getIntersection
          (Vector3d *__return_storage_ptr__,Vector2d *vec,Vector3d *_p1,Vector3d *_p2,Vector2d *obs)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  Scalar *dst_ptr;
  ActualDstType actualDst;
  uint uVar6;
  ulong uVar7;
  uint uVar8;
  double dVar9;
  double dVar10;
  Scalar temp;
  double dVar11;
  double dVar12;
  Vector2d pt;
  double local_98 [4];
  double local_78;
  double dStack_70;
  
  dVar2 = (_p1->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).m_storage.m_data.array
          [0];
  dVar3 = (_p1->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).m_storage.m_data.array
          [1];
  dVar9 = (_p2->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).m_storage.m_data.array
          [0] - dVar2;
  dVar10 = (_p2->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).m_storage.m_data.
           array[1] - dVar3;
  dVar1 = (vec->super_PlainObjectBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>).m_storage.m_data.array
          [0];
  dVar12 = (vec->super_PlainObjectBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>).m_storage.m_data.
           array[1];
  dVar11 = -dVar12;
  dVar4 = (obs->super_PlainObjectBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>).m_storage.m_data.array
          [0];
  dVar5 = (obs->super_PlainObjectBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>).m_storage.m_data.array
          [1];
  local_78 = dVar1 * dVar5 + dVar11 * dVar4;
  dStack_70 = dVar9 * dVar3 + -dVar10 * dVar2;
  if (1e-05 <= ABS(dVar10 * dVar1 - dVar12 * dVar9)) {
    dVar12 = 1.0 / (dVar9 * dVar11 + dVar10 * dVar1);
    local_98[0] = dStack_70 * -dVar1 * dVar12 + local_78 * dVar9 * dVar12;
    local_98[1] = dStack_70 * dVar11 * dVar12 + local_78 * dVar10 * dVar12;
    local_98[3] = atan2(local_98[1] - dVar5,local_98[0] - dVar4);
    uVar8 = (uint)((ulong)__return_storage_ptr__ >> 3) & 1;
    uVar6 = 2 - uVar8 & 0xfffffffe;
    if (((uint)__return_storage_ptr__ >> 3 & 1) != 0) {
      (__return_storage_ptr__->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).
      m_storage.m_data.array[0] = local_98[0];
    }
    if (uVar6 != 0) {
      memcpy((void *)((long)(__return_storage_ptr__->
                            super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).m_storage.
                            m_data.array + (ulong)(uVar8 * 8)),
             (void *)((long)local_98 + (ulong)(uVar8 * 8)),0x10);
    }
    if (((ulong)__return_storage_ptr__ >> 3 & 1) != 0) {
      uVar7 = (ulong)((uVar6 | uVar8) << 3);
      *(undefined8 *)
       ((long)(__return_storage_ptr__->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>)
              .m_storage.m_data.array + uVar7) = *(undefined8 *)((long)local_98 + uVar7);
    }
    (__return_storage_ptr__->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).m_storage
    .m_data.array[2] = local_98[3];
  }
  else {
    (__return_storage_ptr__->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).m_storage
    .m_data.array[2] =
         (_p1->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).m_storage.m_data.array
         [2];
    dVar1 = (_p1->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).m_storage.m_data.
            array[1];
    (__return_storage_ptr__->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).m_storage
    .m_data.array[0] =
         (_p1->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).m_storage.m_data.array
         [0];
    (__return_storage_ptr__->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).m_storage
    .m_data.array[1] = dVar1;
  }
  return __return_storage_ptr__;
}

Assistant:

Eigen::Vector3d Object::getIntersection(
    const Eigen::Vector2d& vec,
    const Eigen::Vector3d& _p1,
    const Eigen::Vector3d& _p2, 
    const Eigen::Vector2d& obs
) {
    const Eigen::Vector2d p1 = _p1.block<2, 1>(0, 0), p2 = _p2.block<2, 1>(0, 0);
    const Eigen::Vector2d vec_line = p2 - p1;
    Eigen::Matrix2d A = Eigen::Matrix2d::Zero();
    A << -vec(1), vec(0), -vec_line(1), vec_line(0);
    double b1 = Eigen::RowVector2d(-vec(1), vec(0)) * obs;
    double b2 = Eigen::RowVector2d(-vec_line(1), vec_line(0)) * p1;
    const Eigen::Vector2d b(b1, b2);
    double det = A(0, 0) * A(1, 1) - A(0, 1) * A(1, 0);
    if (std::abs(det) < 1e-5)
        return _p1;
    const Eigen::Vector2d pt = A.inverse() * b, new_vec = pt - obs;
    double angle = atan2(new_vec(1), new_vec(0));
    Eigen::Vector3d result;
    result << pt, angle;
    return result;                   // 解交点
}